

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O3

Extra_FileReader_t *
Extra_FileReaderAlloc(char *pFileName,char *pCharsComment,char *pCharsStop,char *pCharsClean)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  Extra_FileReader_t *pEVar3;
  long lVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  byte *pbVar10;
  char *pcVar11;
  int iVar12;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pEVar3 = (Extra_FileReader_t *)0x0;
    printf("Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    pEVar3 = (Extra_FileReader_t *)calloc(1,0x158);
    pEVar3->pFileName = pFileName;
    pEVar3->pFile = (FILE *)__stream;
    pcVar5 = pEVar3->pCharMap;
    memset(pcVar5,1,0x100);
    bVar1 = *pCharsComment;
    if (bVar1 != 0) {
      pbVar10 = (byte *)(pCharsComment + 1);
      do {
        pcVar5[bVar1] = '\0';
        bVar1 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar1 != 0);
    }
    bVar1 = *pCharsStop;
    if (bVar1 != 0) {
      pbVar10 = (byte *)(pCharsStop + 1);
      do {
        pcVar5[bVar1] = '\x02';
        bVar1 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar1 != 0);
    }
    bVar1 = *pCharsClean;
    if (bVar1 != 0) {
      pbVar10 = (byte *)(pCharsClean + 1);
      do {
        pcVar5[bVar1] = '\x03';
        bVar1 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar1 != 0);
    }
    fseek(__stream,0,2);
    lVar4 = ftell(__stream);
    iVar12 = (int)lVar4;
    pEVar3->nFileSize = iVar12;
    rewind(__stream);
    pcVar5 = (char *)malloc(0x400001);
    pEVar3->pBuffer = pcVar5;
    pEVar3->nBufferSize = 0x400000;
    pEVar3->pBufferCur = pcVar5;
    iVar2 = 0x400000;
    if (iVar12 < 0x400000) {
      iVar2 = iVar12;
    }
    fread(pcVar5,(long)iVar2,1,__stream);
    pEVar3->nFileRead = iVar2;
    pEVar3->pBufferEnd = pcVar5 + iVar2;
    pcVar11 = pcVar5 + 0x3ff000;
    if (iVar12 < 0x400001) {
      pcVar11 = pcVar5 + iVar2;
    }
    pEVar3->pBufferStop = pcVar11;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    ppvVar7 = (void **)malloc(800);
    pVVar6->pArray = ppvVar7;
    pEVar3->vTokens = pVVar6;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(400);
    pVVar8->pArray = piVar9;
    pEVar3->vLines = pVVar8;
    pEVar3->nLineCounter = 1;
  }
  return pEVar3;
}

Assistant:

Extra_FileReader_t * Extra_FileReaderAlloc( char * pFileName, 
    char * pCharsComment, char * pCharsStop, char * pCharsClean )
{
    Extra_FileReader_t * p;
    FILE * pFile;
    char * pChar;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Extra_FileReader_t, 1 );
    memset( p, 0, sizeof(Extra_FileReader_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // set the character map
    memset( p->pCharMap, EXTRA_CHAR_NORMAL, 256 );
    for ( pChar = pCharsComment; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_COMMENT;
    for ( pChar = pCharsStop; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_STOP;
    for ( pChar = pCharsClean; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_CLEAN;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, EXTRA_BUFFER_SIZE+1 );
    p->nBufferSize = EXTRA_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = EXTRA_MINIMUM(p->nFileSize, EXTRA_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + EXTRA_BUFFER_SIZE - EXTRA_OFFSET_SIZE;
    // start the arrays
    p->vTokens = Vec_PtrAlloc( 100 );
    p->vLines = Vec_IntAlloc( 100 );
    p->nLineCounter = 1; // 1-based line counting
    return p;
}